

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

void Omega_h::repro_sum(CommPtr *comm,Reals *a,Int ncomps,Real *result)

{
  Real RVar1;
  Read<double> local_60;
  Reals local_50;
  shared_ptr<Omega_h::Comm> local_40;
  int local_2c;
  Real *pRStack_28;
  Int comp;
  Real *result_local;
  Reals *pRStack_18;
  Int ncomps_local;
  Reals *a_local;
  CommPtr *comm_local;
  
  pRStack_28 = result;
  result_local._4_4_ = ncomps;
  pRStack_18 = a;
  a_local = (Reals *)comm;
  for (local_2c = 0; local_2c < result_local._4_4_; local_2c = local_2c + 1) {
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_40,comm);
    Read<double>::Read(&local_60,a);
    get_component<double>((Omega_h *)&local_50,&local_60,result_local._4_4_,local_2c);
    RVar1 = repro_sum(&local_40,&local_50);
    pRStack_28[local_2c] = RVar1;
    Read<double>::~Read(&local_50);
    Read<double>::~Read(&local_60);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_40);
  }
  return;
}

Assistant:

void repro_sum(CommPtr comm, Reals a, Int ncomps, Real result[]) {
  for (Int comp = 0; comp < ncomps; ++comp) {
    result[comp] = repro_sum(comm, get_component(a, ncomps, comp));
  }
}